

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendarwidget.cpp
# Opt level: O0

void __thiscall QCalendarWidget::QCalendarWidget(QCalendarWidget *this,QWidget *parent)

{
  QCalendarView *pQVar1;
  QLatin1StringView str;
  QWidget *parent_00;
  QCalendarWidgetPrivate *pQVar2;
  QCalendarWidgetPrivate *pQVar3;
  QCalendarModel *this_00;
  QCalendarView *this_01;
  QItemSelectionModel *pQVar4;
  QCalendarDelegate *pQVar5;
  QCalendarTextNavigator *pQVar6;
  QCalendarTextNavigator *in_RSI;
  char *in_RDI;
  long in_FS_OFFSET;
  QVBoxLayout *layoutV;
  QCalendarWidgetPrivate *d;
  QTextCharFormat fmt;
  QCalendarWidgetPrivate *in_stack_fffffffffffffde0;
  QWidgetPrivate *in_stack_fffffffffffffde8;
  undefined1 uVar7;
  QCalendarWidgetPrivate *w;
  QFlagsStorage<Qt::AlignmentFlag> alignment;
  QWidget *in_stack_fffffffffffffdf0;
  QCalendarWidgetPrivate *this_02;
  QFlagsStorage<Qt::WindowType> in_stack_fffffffffffffdfc;
  QObject *parent_01;
  QCalendarWidgetPrivate *this_03;
  QWidget *w_00;
  QObject local_b0 [8];
  QObject local_a8 [8];
  QObject local_a0 [8];
  QObject local_98 [8];
  QObject local_90 [8];
  QObject local_88 [8];
  QObject local_80 [8];
  QObject local_78 [8];
  QWidget *in_stack_ffffffffffffff90;
  QCalendarWidgetPrivate *in_stack_ffffffffffffff98;
  undefined1 local_58 [28];
  undefined4 local_3c;
  undefined1 local_38 [40];
  undefined1 *puStack_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  parent_00 = (QWidget *)operator_new(0x2e0);
  QCalendarWidgetPrivate::QCalendarWidgetPrivate(in_stack_fffffffffffffde0);
  local_3c = 0;
  QFlags<Qt::WindowType>::QFlags((QFlags<Qt::WindowType> *)0x51db97);
  QWidget::QWidget(in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,(QWidget *)in_RSI,
                   (WindowFlags)in_stack_fffffffffffffdfc.i);
  uVar7 = (undefined1)((ulong)in_stack_fffffffffffffde8 >> 0x38);
  *(undefined ***)in_RDI = &PTR_metaObject_00d0f728;
  *(undefined ***)(in_RDI + 0x10) = &PTR__QCalendarWidget_00d0f8e0;
  pQVar2 = d_func((QCalendarWidget *)0x51dbdc);
  QWidget::setAutoFillBackground(in_stack_fffffffffffffdf0,(bool)uVar7);
  QWidget::setBackgroundRole((QWidget *)in_RSI,(ColorRole)((ulong)parent_00 >> 0x20));
  pQVar3 = (QCalendarWidgetPrivate *)operator_new(0x20);
  QVBoxLayout::QVBoxLayout((QVBoxLayout *)in_RSI,parent_00);
  parent_01 = (QObject *)(local_58 + 0xc);
  w = pQVar3;
  this_02 = pQVar3;
  QMargins::QMargins((QMargins *)in_RSI);
  QLayout::setContentsMargins((QLayout *)this_02,(QMargins *)w);
  this_00 = (QCalendarModel *)operator_new(0xe8);
  QtPrivate::QCalendarModel::QCalendarModel(this_00,parent_01);
  pQVar2->m_model = this_00;
  local_38._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
  puStack_10 = &DAT_aaaaaaaaaaaaaaaa;
  QTextCharFormat::QTextCharFormat((QTextCharFormat *)(local_38 + 0x20));
  this_03 = (QCalendarWidgetPrivate *)local_58;
  QBrush::QBrush((QBrush *)this_03,red,SolidPattern);
  QTextFormat::setForeground((QTextFormat *)w,(QBrush *)in_RSI);
  QBrush::~QBrush((QBrush *)this_03);
  QTextCharFormat::QTextCharFormat((QTextCharFormat *)in_RSI,(QTextCharFormat *)parent_00);
  QtPrivate::StaticDayOfWeekAssociativeArray<QTextCharFormat>::insert
            ((StaticDayOfWeekAssociativeArray<QTextCharFormat> *)this_02,
             (DayOfWeek)((ulong)w >> 0x20),(QTextCharFormat *)in_RSI);
  QTextCharFormat::~QTextCharFormat((QTextCharFormat *)0x51dd53);
  w_00 = (QWidget *)local_38;
  QTextCharFormat::QTextCharFormat((QTextCharFormat *)in_RSI,(QTextCharFormat *)parent_00);
  QtPrivate::StaticDayOfWeekAssociativeArray<QTextCharFormat>::insert
            ((StaticDayOfWeekAssociativeArray<QTextCharFormat> *)this_02,
             (DayOfWeek)((ulong)w >> 0x20),(QTextCharFormat *)in_RSI);
  QTextCharFormat::~QTextCharFormat((QTextCharFormat *)0x51dda2);
  this_01 = (QCalendarView *)operator_new(0x30);
  QtPrivate::QCalendarView::QCalendarView((QCalendarView *)in_RSI,parent_00);
  pQVar2->m_view = this_01;
  pQVar1 = pQVar2->m_view;
  Qt::Literals::StringLiterals::operator____L1((char *)w,(size_t)in_RSI);
  str.m_data._0_4_ = (int)parent_01;
  str.m_size = (qsizetype)this_02;
  str.m_data._4_4_ = (int)((ulong)parent_01 >> 0x20);
  QAnyStringView::QAnyStringView((QAnyStringView *)w,str);
  QObject::setObjectName((QAnyStringView *)pQVar1);
  (**(code **)(*(long *)&(pQVar2->m_view->super_QTableView).super_QAbstractItemView.
                         super_QAbstractScrollArea.super_QFrame.super_QWidget + 0x1c8))
            (pQVar2->m_view,pQVar2->m_model);
  QtPrivate::QCalendarModel::setView(pQVar2->m_model,pQVar2->m_view);
  QAbstractItemView::setSelectionBehavior
            ((QAbstractItemView *)in_RSI,(SelectionBehavior)((ulong)parent_00 >> 0x20));
  QAbstractItemView::setSelectionMode
            ((QAbstractItemView *)in_RSI,(SelectionMode)((ulong)parent_00 >> 0x20));
  QTableView::horizontalHeader((QTableView *)in_RSI);
  QHeaderView::setSectionResizeMode((QHeaderView *)this_02,(ResizeMode)((ulong)w >> 0x20));
  QTableView::horizontalHeader((QTableView *)in_RSI);
  QHeaderView::setSectionsClickable((QHeaderView *)in_RSI,SUB81((ulong)parent_00 >> 0x38,0));
  QTableView::verticalHeader((QTableView *)in_RSI);
  QHeaderView::setSectionResizeMode((QHeaderView *)this_02,(ResizeMode)((ulong)w >> 0x20));
  QTableView::verticalHeader((QTableView *)in_RSI);
  QHeaderView::setSectionsClickable((QHeaderView *)in_RSI,SUB81((ulong)parent_00 >> 0x38,0));
  pQVar4 = QAbstractItemView::selectionModel((QAbstractItemView *)in_RSI);
  pQVar2->m_selection = pQVar4;
  QCalendarWidgetPrivate::createNavigationBar(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  QFrame::setFrameStyle((QFrame *)this_02,(int)((ulong)w >> 0x20));
  pQVar5 = (QCalendarDelegate *)operator_new(0xe8);
  QtPrivate::QCalendarDelegate::QCalendarDelegate
            ((QCalendarDelegate *)this_02,w,&in_RSI->super_QObject);
  pQVar2->m_delegate = pQVar5;
  QAbstractItemView::setItemDelegate
            ((QAbstractItemView *)this_02,(QAbstractItemDelegate *)parent_01);
  uVar7 = (undefined1)((ulong)parent_01 >> 0x38);
  QCalendarWidgetPrivate::update(this_02);
  QCalendarWidgetPrivate::updateNavigationBar(this_03);
  QWidget::setFocusPolicy((QWidget *)in_RSI,(FocusPolicy)((ulong)parent_00 >> 0x20));
  QWidget::setFocusProxy((QWidget *)this_01,w_00);
  QWidget::setSizePolicy((QWidget *)in_RSI,(Policy)((ulong)parent_00 >> 0x20),(Policy)parent_00);
  QObject::connect((QObject *)&stack0xffffffffffffff90,(char *)pQVar2->m_view,
                   (QObject *)"2showDate(QDate)",in_RDI,0xb13e58);
  QMetaObject::Connection::~Connection((Connection *)&stack0xffffffffffffff90);
  QObject::connect(local_78,(char *)pQVar2->m_view,(QObject *)"2changeDate(QDate,bool)",in_RDI,
                   0xb13e88);
  QMetaObject::Connection::~Connection((Connection *)local_78);
  QObject::connect(local_80,(char *)pQVar2->m_view,(QObject *)"2clicked(QDate)",in_RDI,0xb13ea7);
  QMetaObject::Connection::~Connection((Connection *)local_80);
  QObject::connect(local_88,(char *)pQVar2->m_view,(QObject *)"2editingFinished()",in_RDI,0xb13d8e);
  QMetaObject::Connection::~Connection((Connection *)local_88);
  QObject::connect(local_90,(char *)pQVar2->prevMonth,(QObject *)"2clicked(bool)",in_RDI,0xb13ec6);
  QMetaObject::Connection::~Connection((Connection *)local_90);
  QObject::connect(local_98,(char *)pQVar2->nextMonth,(QObject *)"2clicked(bool)",in_RDI,0xb13edd);
  QMetaObject::Connection::~Connection((Connection *)local_98);
  QObject::connect(local_a0,(char *)pQVar2->yearButton,(QObject *)"2clicked(bool)",in_RDI,0xb13ef4);
  QMetaObject::Connection::~Connection((Connection *)local_a0);
  QObject::connect(local_a8,(char *)pQVar2->monthMenu,(QObject *)"2triggered(QAction*)",in_RDI,
                   0xb13f1b);
  QMetaObject::Connection::~Connection((Connection *)local_a8);
  QObject::connect(local_b0,(char *)pQVar2->yearEdit,(QObject *)"2editingFinished()",in_RDI,0xb13f36
                  );
  QMetaObject::Connection::~Connection((Connection *)local_b0);
  QMargins::QMargins((QMargins *)in_RSI);
  QLayout::setContentsMargins((QLayout *)this_02,(QMargins *)w);
  alignment.i = (Int)((ulong)w >> 0x20);
  (**(code **)(*(long *)&pQVar3->super_QWidgetPrivate + 0x68))(pQVar3,0);
  QFlags<Qt::AlignmentFlag>::QFlags((QFlags<Qt::AlignmentFlag> *)0x51e3b1);
  QBoxLayout::addWidget((QBoxLayout *)in_RSI,parent_00,0,(Alignment)alignment.i);
  QFlags<Qt::AlignmentFlag>::QFlags((QFlags<Qt::AlignmentFlag> *)0x51e413);
  QBoxLayout::addWidget((QBoxLayout *)in_RSI,parent_00,0,(Alignment)alignment.i);
  pQVar6 = (QCalendarTextNavigator *)operator_new(0x50);
  QtPrivate::QCalendarTextNavigator::QCalendarTextNavigator(in_RSI,&parent_00->super_QObject);
  pQVar2->m_navigator = pQVar6;
  setDateEditEnabled((QCalendarWidget *)this_00,(bool)uVar7);
  QTextCharFormat::~QTextCharFormat((QTextCharFormat *)0x51e490);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QCalendarWidget::QCalendarWidget(QWidget *parent)
    : QWidget(*new QCalendarWidgetPrivate, parent, { })
{
    Q_D(QCalendarWidget);

    setAutoFillBackground(true);
    setBackgroundRole(QPalette::Window);

    QVBoxLayout *layoutV = new QVBoxLayout(this);
    layoutV->setContentsMargins(QMargins());
    d->m_model = new QCalendarModel(this);
    QTextCharFormat fmt;
    fmt.setForeground(QBrush(Qt::red));
    d->m_model->m_dayFormats.insert(Qt::Saturday, fmt);
    d->m_model->m_dayFormats.insert(Qt::Sunday, fmt);
    d->m_view = new QCalendarView(this);
    d->m_view->setObjectName("qt_calendar_calendarview"_L1);
    d->m_view->setModel(d->m_model);
    d->m_model->setView(d->m_view);
    d->m_view->setSelectionBehavior(QAbstractItemView::SelectItems);
    d->m_view->setSelectionMode(QAbstractItemView::SingleSelection);
    d->m_view->horizontalHeader()->setSectionResizeMode(QHeaderView::Stretch);
    d->m_view->horizontalHeader()->setSectionsClickable(false);
    d->m_view->verticalHeader()->setSectionResizeMode(QHeaderView::Stretch);
    d->m_view->verticalHeader()->setSectionsClickable(false);
    d->m_selection = d->m_view->selectionModel();
    d->createNavigationBar(this);
    d->m_view->setFrameStyle(QFrame::NoFrame);
    d->m_delegate = new QCalendarDelegate(d, this);
    d->m_view->setItemDelegate(d->m_delegate);
    d->update();
    d->updateNavigationBar();
    setFocusPolicy(Qt::StrongFocus);
    setFocusProxy(d->m_view);
    setSizePolicy(QSizePolicy::Preferred, QSizePolicy::Preferred);

    connect(d->m_view, SIGNAL(showDate(QDate)),
            this, SLOT(_q_slotShowDate(QDate)));
    connect(d->m_view, SIGNAL(changeDate(QDate,bool)),
            this, SLOT(_q_slotChangeDate(QDate,bool)));
    connect(d->m_view, SIGNAL(clicked(QDate)),
            this, SIGNAL(clicked(QDate)));
    connect(d->m_view, SIGNAL(editingFinished()),
            this, SLOT(_q_editingFinished()));

    connect(d->prevMonth, SIGNAL(clicked(bool)),
            this, SLOT(_q_prevMonthClicked()));
    connect(d->nextMonth, SIGNAL(clicked(bool)),
            this, SLOT(_q_nextMonthClicked()));
    connect(d->yearButton, SIGNAL(clicked(bool)),
            this, SLOT(_q_yearClicked()));
    connect(d->monthMenu, SIGNAL(triggered(QAction*)),
            this, SLOT(_q_monthChanged(QAction*)));
    connect(d->yearEdit, SIGNAL(editingFinished()),
            this, SLOT(_q_yearEditingFinished()));

    layoutV->setContentsMargins(QMargins());
    layoutV->setSpacing(0);
    layoutV->addWidget(d->navBarBackground);
    layoutV->addWidget(d->m_view);

    d->m_navigator = new QCalendarTextNavigator(this);
    setDateEditEnabled(true);
}